

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cpp
# Opt level: O0

int __thiscall QUEUE::operator[](QUEUE *this,int x)

{
  int iVar1;
  out_of_range *this_00;
  int output_len;
  int x_local;
  QUEUE *this_local;
  
  if (-1 < x) {
    iVar1 = (*(this->super_STACK)._vptr_STACK[1])();
    if (x < iVar1) {
      iVar1 = STACK::operator_cast_to_int(&this->s2);
      if (x < iVar1) {
        iVar1 = STACK::operator_cast_to_int(&this->s2);
        this_local._4_4_ = STACK::operator[](&this->s2,(iVar1 + -1) - x);
      }
      else {
        this_local._4_4_ = STACK::operator[](&this->super_STACK,x - iVar1);
      }
      return this_local._4_4_;
    }
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"[ERROR] Index out of range!");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

int QUEUE::operator[](int x) const {
  if (x < 0 || x >= int(*this))
    throw std::out_of_range("[ERROR] Index out of range!");
  int output_len = int(s2);
  // If x in the output stack
	if (x < output_len)
    return s2[int(s2) - 1 - x];
  // X in the input stack
  else
    return this->STACK::operator[](x - output_len);
}